

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationCurveOccurrence::IfcAnnotationCurveOccurrence
          (IfcAnnotationCurveOccurrence *this)

{
  IfcAnnotationCurveOccurrence *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcAnnotationOccurrence).field_0x90,
             "IfcAnnotationCurveOccurrence");
  IfcAnnotationOccurrence::IfcAnnotationOccurrence
            (&this->super_IfcAnnotationOccurrence,&PTR_construction_vtable_24__00e9ca98);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationCurveOccurrence,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationCurveOccurrence,_0UL> *)
             &(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x80,
             &PTR_construction_vtable_24__00e9cb10);
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem = 0xe9c9e0;
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).field_0x90 = 0xe9ca80;
  (this->super_IfcAnnotationOccurrence).super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)0xe9ca08;
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x70 = 0xe9ca30;
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x80 = 0xe9ca58;
  return;
}

Assistant:

IfcAnnotationCurveOccurrence() : Object("IfcAnnotationCurveOccurrence") {}